

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestDyndepBuild::Run(BuildTestDyndepBuild *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  reference pvVar7;
  size_type sVar8;
  size_type sVar9;
  allocator<char> local_121;
  key_type local_120;
  allocator<char> local_f9;
  key_type local_f8;
  undefined4 local_d4;
  size_type local_d0;
  size_t files_created;
  string local_c0;
  undefined1 local_a0 [8];
  string err;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  BuildTestDyndepBuild *pBStack_10;
  int fail_count;
  BuildTestDyndepBuild *this_local;
  
  pBStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule touch\n  command = touch $out\nrule cp\n  command = cp $in $out\nbuild dd: cp dd-in\nbuild out: touch || dd\n  dyndep = dd\n"
              ,local_1c);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"dd-in",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"ninja_dyndep_version = 1\nbuild out: dyndep\n",
               (allocator<char> *)(err.field_2._M_local_buf + 0xf));
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::__cxx11::string::string((string *)local_a0);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"out",(allocator<char> *)((long)&files_created + 7));
    pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_c0,(string *)local_a0);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xbde,"builder_.AddTarget(\"out\", &err)");
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&files_created + 7));
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a0);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xbdf,"\"\" == err");
    local_d0 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&(this->super_BuildTest).fs_.files_created_);
    pTVar1 = g_current_test;
    bVar3 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_a0);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xbe2,"builder_.Build(&err)");
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a0);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xbe3,"\"\" == err");
    pTVar1 = g_current_test;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
    bVar3 = testing::Test::Check
                      (pTVar1,sVar6 == 2,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xbe5,"2u == command_runner_.commands_ran_.size()");
    pTVar1 = g_current_test;
    if (bVar3) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,0);
      bVar3 = std::operator==("cp dd-in dd",pvVar7);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0xbe6,"\"cp dd-in dd\" == command_runner_.commands_ran_[0]");
      pTVar1 = g_current_test;
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,1);
      bVar3 = std::operator==("touch out",pvVar7);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0xbe7,"\"touch out\" == command_runner_.commands_ran_[1]");
      pTVar1 = g_current_test;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_BuildTest).fs_.files_read_);
      bVar3 = testing::Test::Check
                        (pTVar1,sVar6 == 2,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0xbe8,"2u == fs_.files_read_.size()");
      pTVar1 = g_current_test;
      if (bVar3) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&(this->super_BuildTest).fs_.files_read_,0);
        bVar3 = std::operator==("dd-in",pvVar7);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0xbe9,"\"dd-in\" == fs_.files_read_[0]");
        pTVar1 = g_current_test;
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&(this->super_BuildTest).fs_.files_read_,1);
        bVar3 = std::operator==("dd",pvVar7);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0xbea,"\"dd\" == fs_.files_read_[1]");
        pTVar1 = g_current_test;
        sVar8 = local_d0 + 2;
        sVar9 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&(this->super_BuildTest).fs_.files_created_);
        bVar3 = testing::Test::Check
                          (pTVar1,sVar8 == sVar9,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0xbeb,"2u + files_created == fs_.files_created_.size()");
        pTVar1 = g_current_test;
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"dd",&local_f9);
          sVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&(this->super_BuildTest).fs_.files_created_,&local_f8);
          testing::Test::Check
                    (pTVar1,sVar8 == 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0xbec,"1u == fs_.files_created_.count(\"dd\")");
          std::__cxx11::string::~string((string *)&local_f8);
          std::allocator<char>::~allocator(&local_f9);
          pTVar1 = g_current_test;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"out",&local_121);
          sVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&(this->super_BuildTest).fs_.files_created_,&local_120);
          testing::Test::Check
                    (pTVar1,sVar8 == 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0xbed,"1u == fs_.files_created_.count(\"out\")");
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator(&local_121);
          local_d4 = 0;
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          local_d4 = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_d4 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_d4 = 1;
    }
    std::__cxx11::string::~string((string *)local_a0);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildTest, DyndepBuild) {
  // Verify that a dyndep file can be built and loaded to discover nothing.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out\n"
"rule cp\n"
"  command = cp $in $out\n"
"build dd: cp dd-in\n"
"build out: touch || dd\n"
"  dyndep = dd\n"
));
  fs_.Create("dd-in",
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"
);

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  EXPECT_EQ("", err);

  size_t files_created = fs_.files_created_.size();
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  ASSERT_EQ(2u, command_runner_.commands_ran_.size());
  EXPECT_EQ("cp dd-in dd", command_runner_.commands_ran_[0]);
  EXPECT_EQ("touch out", command_runner_.commands_ran_[1]);
  ASSERT_EQ(2u, fs_.files_read_.size());
  EXPECT_EQ("dd-in", fs_.files_read_[0]);
  EXPECT_EQ("dd", fs_.files_read_[1]);
  ASSERT_EQ(2u + files_created, fs_.files_created_.size());
  EXPECT_EQ(1u, fs_.files_created_.count("dd"));
  EXPECT_EQ(1u, fs_.files_created_.count("out"));
}